

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::CJoint::Prepare(CJoint *this,btScalar dt,int iterations)

{
  undefined8 uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  Body::activate((this->super_Joint).m_bodies);
  Body::activate((this->super_Joint).m_bodies + 1);
  iVar2 = this->m_life;
  (this->super_Joint).m_delete = this->m_maxlife <= iVar2;
  this->m_life = iVar2 + 1;
  if (iVar2 == 0) {
    fVar4 = (this->super_Joint).m_erp;
    fVar9 = (this->super_Joint).m_split;
    fVar5 = (this->super_Joint).m_drift.m_floats[2];
    fVar6 = 1.0 / dt;
    *(ulong *)(this->super_Joint).m_drift.m_floats =
         CONCAT44(fVar6 * (this->super_Joint).m_drift.m_floats[1] * fVar4,
                  fVar6 * fVar4 * (this->super_Joint).m_drift.m_floats[0]);
    *(ulong *)((this->super_Joint).m_drift.m_floats + 2) = (ulong)(uint)(fVar6 * fVar5 * fVar4);
    if (0.0 < fVar9) {
      fVar4 = (this->super_Joint).m_drift.m_floats[2];
      fVar6 = fVar9 * fVar4;
      fVar5 = 1.0 - fVar9;
      uVar1 = *(undefined8 *)(this->super_Joint).m_drift.m_floats;
      fVar8 = (float)uVar1;
      fVar7 = fVar9 * fVar8;
      fVar10 = (float)((ulong)uVar1 >> 0x20);
      fVar9 = fVar10 * fVar9;
      auVar3._4_4_ = fVar6 * (this->super_Joint).m_massmatrix.m_el[1].m_floats[2] +
                     fVar7 * (this->super_Joint).m_massmatrix.m_el[1].m_floats[0] +
                     (this->super_Joint).m_massmatrix.m_el[1].m_floats[1] * fVar9;
      auVar3._0_4_ = fVar6 * (this->super_Joint).m_massmatrix.m_el[0].m_floats[2] +
                     fVar7 * (this->super_Joint).m_massmatrix.m_el[0].m_floats[0] +
                     (this->super_Joint).m_massmatrix.m_el[0].m_floats[1] * fVar9;
      auVar3._8_4_ = fVar6 * (this->super_Joint).m_massmatrix.m_el[2].m_floats[2] +
                     fVar7 * (this->super_Joint).m_massmatrix.m_el[2].m_floats[0] +
                     fVar9 * (this->super_Joint).m_massmatrix.m_el[2].m_floats[1];
      auVar3._12_4_ = 0;
      *(undefined1 (*) [16])(this->super_Joint).m_sdrift.m_floats = auVar3;
      *(ulong *)(this->super_Joint).m_drift.m_floats = CONCAT44(fVar5 * fVar10,fVar5 * fVar8);
      (this->super_Joint).m_drift.m_floats[2] = fVar5 * fVar4;
    }
    fVar4 = 1.0 / (float)iterations;
    uVar1 = *(undefined8 *)(this->super_Joint).m_drift.m_floats;
    *(ulong *)(this->super_Joint).m_drift.m_floats =
         CONCAT44(fVar4 * (float)((ulong)uVar1 >> 0x20),fVar4 * (float)uVar1);
    (this->super_Joint).m_drift.m_floats[2] = fVar4 * (this->super_Joint).m_drift.m_floats[2];
  }
  else {
    (this->super_Joint).m_sdrift.m_floats[0] = 0.0;
    (this->super_Joint).m_sdrift.m_floats[1] = 0.0;
    (this->super_Joint).m_sdrift.m_floats[2] = 0.0;
    (this->super_Joint).m_sdrift.m_floats[3] = 0.0;
    (this->super_Joint).m_drift.m_floats[0] = 0.0;
    (this->super_Joint).m_drift.m_floats[1] = 0.0;
    (this->super_Joint).m_drift.m_floats[2] = 0.0;
    (this->super_Joint).m_drift.m_floats[3] = 0.0;
  }
  return;
}

Assistant:

void				btSoftBody::CJoint::Prepare(btScalar dt,int iterations)
{
	Joint::Prepare(dt,iterations);
	const bool	dodrift=(m_life==0);
	m_delete=(++m_life)>m_maxlife;
	if(dodrift)
	{
		m_drift=m_drift*m_erp/dt;
		if(m_split>0)
		{
			m_sdrift	=	m_massmatrix*(m_drift*m_split);
			m_drift		*=	1-m_split;
		}
		m_drift/=(btScalar)iterations;
	}
	else
	{
		m_drift=m_sdrift=btVector3(0,0,0);
	}
}